

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

void __thiscall FIX::Initiator::start(Initiator *this)

{
  bool bVar1;
  RuntimeError *this_00;
  allocator<char> local_31;
  string local_30;
  Initiator *local_10;
  Initiator *this_local;
  
  this->m_stop = false;
  local_10 = this;
  (*this->_vptr_Initiator[2])(this,&this->m_settings);
  (*this->_vptr_Initiator[3])(this,&this->m_settings);
  HttpServer::startGlobal(&this->m_settings);
  bVar1 = thread_spawn(startThread,this,&this->m_threadid);
  if (!bVar1) {
    this_00 = (RuntimeError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Unable to spawn thread",&local_31);
    RuntimeError::RuntimeError(this_00,&local_30);
    __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  return;
}

Assistant:

void Initiator::start() EXCEPT ( ConfigError, RuntimeError )
{
  m_stop = false;
  onConfigure( m_settings );
  onInitialize( m_settings );

  HttpServer::startGlobal( m_settings );

  if( !thread_spawn( &startThread, this, m_threadid ) )
    throw RuntimeError("Unable to spawn thread");
}